

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pocketsphinx.c
# Opt level: O2

int ps_search_forward(ps_decoder_t *ps)

{
  int iVar1;
  int iVar2;
  acmod_t *acmod;
  
  if (ps->search == (ps_search_t *)0x0) {
    err_msg(ERR_ERROR,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/pocketsphinx.c"
            ,0x49b,
            "No search module is selected, did you forget to specify a language model or grammar?\n"
           );
    iVar2 = -1;
  }
  else {
    iVar2 = 0;
    while (acmod = ps->acmod, 0 < acmod->n_feat_frame) {
      iVar1 = ps->pl_window;
      if (0 < iVar1) {
        iVar1 = (*ps->phone_loop->vt->step)(ps->phone_loop,acmod->output_frame);
        if (iVar1 < 0) {
          return iVar1;
        }
        acmod = ps->acmod;
        iVar1 = ps->pl_window;
      }
      if (iVar1 <= acmod->output_frame) {
        iVar1 = (*ps->search->vt->step)(ps->search,acmod->output_frame - iVar1);
        if (iVar1 < 0) {
          return iVar1;
        }
        acmod = ps->acmod;
      }
      acmod_advance(acmod);
      ps->n_frame = ps->n_frame + 1;
      iVar2 = iVar2 + 1;
    }
  }
  return iVar2;
}

Assistant:

static int
ps_search_forward(ps_decoder_t *ps)
{
    int nfr;

    if (ps->search == NULL) {
        E_ERROR("No search module is selected, did you forget to "
                "specify a language model or grammar?\n");
        return -1;
    }
    nfr = 0;
    while (ps->acmod->n_feat_frame > 0) {
        int k;
        if (ps->pl_window > 0)
            if ((k = ps_search_step(ps->phone_loop, ps->acmod->output_frame)) < 0)
                return k;
        if (ps->acmod->output_frame >= ps->pl_window)
            if ((k = ps_search_step(ps->search,
                                    ps->acmod->output_frame - ps->pl_window)) < 0)
                return k;
        acmod_advance(ps->acmod);
        ++ps->n_frame;
        ++nfr;
    }
    return nfr;
}